

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O1

void __thiscall
ODDLParser::OpenDDLParserTest_getNextSeparatorTest_Test::
~OpenDDLParserTest_getNextSeparatorTest_Test(OpenDDLParserTest_getNextSeparatorTest_Test *this)

{
  pointer ppVVar1;
  
  (this->super_OpenDDLParserTest).super_Test._vptr_Test =
       (_func_int **)&PTR__OpenDDLParserTest_0018bff0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->super_OpenDDLParserTest).m_logs);
  ppVVar1 = (this->super_OpenDDLParserTest).m_data.
            super__Vector_base<ODDLParser::Value_*,_std::allocator<ODDLParser::Value_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppVVar1 != (pointer)0x0) {
    operator_delete(ppVVar1,(long)(this->super_OpenDDLParserTest).m_data.
                                  super__Vector_base<ODDLParser::Value_*,_std::allocator<ODDLParser::Value_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVVar1
                   );
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x40);
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, getNextSeparatorTest) {
    char tokenlist[] = "abc, \na";
    char *in(&tokenlist[0]);
    char *end(&tokenlist[strlen("abc, \na")]);

    bool res(true);
    res = isSeparator(*in);
    EXPECT_FALSE(res);
    in = getNextSeparator(in, end);
    res = isSeparator(*in);
    EXPECT_TRUE(res);
    in = getNextSeparator(in, end);
    res = isSeparator(*in);
    EXPECT_TRUE(res);
}